

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_predictor_8x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint16_t *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort extraout_XMM0_Wa;
  ushort extraout_XMM0_Wa_00;
  int i;
  __m128i row;
  uint32_t sum32;
  __m128i sum;
  __m128i zero;
  __m128i sum_above;
  __m128i sum_left;
  int local_1dc;
  uint16_t *in_stack_fffffffffffffe38;
  undefined2 local_1bc;
  uint local_198;
  uint local_188;
  undefined8 *local_150;
  
  dc_sum_16(in_stack_fffffffffffffe38);
  dc_sum_8(in_RDX);
  local_188 = (uint)extraout_XMM0_Wa;
  local_198 = (uint)extraout_XMM0_Wa_00;
  local_1bc = (undefined2)((local_188 + local_198 + 0xc) / 0x18);
  uVar1 = CONCAT26(local_1bc,CONCAT24(local_1bc,CONCAT22(local_1bc,local_1bc)));
  uVar2 = CONCAT26(local_1bc,CONCAT24(local_1bc,CONCAT22(local_1bc,local_1bc)));
  local_150 = in_RDI;
  for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
    *local_150 = uVar1;
    local_150[1] = uVar2;
    local_150 = (undefined8 *)(in_RSI * 2 + (long)local_150);
    *local_150 = uVar1;
    local_150[1] = uVar2;
    local_150 = (undefined8 *)(in_RSI * 2 + (long)local_150);
    *local_150 = uVar1;
    local_150[1] = uVar2;
    local_150 = (undefined8 *)(in_RSI * 2 + (long)local_150);
    *local_150 = uVar1;
    local_150[1] = uVar2;
    local_150 = (undefined8 *)(in_RSI * 2 + (long)local_150);
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_8x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_16(left);
  __m128i sum_above = dc_sum_8(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 12;
  sum32 /= 24;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
  }
}